

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

float __thiscall btVectorX<float>::nrm2(btVectorX<float> *this)

{
  uint uVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  uVar1 = (this->m_storage).m_size;
  pfVar2 = (this->m_storage).m_data;
  if (uVar1 == 1) {
    return ABS(*pfVar2);
  }
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  fVar5 = 1.0;
  fVar7 = 0.0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    fVar6 = pfVar2[uVar4];
    if ((fVar6 != 0.0) || (NAN(fVar6))) {
      fVar6 = ABS(fVar6);
      if (fVar6 <= fVar7) {
        fVar5 = fVar5 + (fVar6 / fVar7) * (fVar6 / fVar7);
      }
      else {
        fVar5 = fVar5 * (fVar7 / fVar6) * (fVar7 / fVar6) + 1.0;
        fVar7 = fVar6;
      }
    }
  }
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  return fVar7 * fVar5;
}

Assistant:

SIMD_FORCE_INLINE	int size() const
		{	
			return m_size;
		}